

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.hh
# Opt level: O3

vector3f tinyusdz::vcross(vector3f *a,vector3f *b)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  vector3f vVar5;
  
  uVar1 = a->y;
  uVar3 = a->z;
  uVar2 = b->y;
  uVar4 = b->z;
  vVar5.x = (float)uVar4 * (float)uVar1 - (float)uVar3 * (float)uVar2;
  vVar5.y = b->x * (float)uVar3 - a->x * (float)uVar4;
  vVar5.z = a->x * (float)uVar2 - b->x * (float)uVar1;
  return vVar5;
}

Assistant:

float operator[](size_t idx) const { return *(&x + idx); }